

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::AppendProperty(cmMakefile *this,string *prop,char *value,bool asString)

{
  cmListFileBacktrace lfbt;
  cmListFileBacktrace local_c8;
  cmListFileBacktrace local_88;
  Directory local_48;
  
  GetBacktrace(&local_c8,this);
  cmState::Snapshot::GetDirectory(&local_48,&this->StateSnapshot);
  local_88.Context.Name._M_dataplus._M_p = (pointer)&local_88.Context.Name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,local_c8.Context.Name._M_dataplus._M_p,
             local_c8.Context.Name._M_dataplus._M_p + local_c8.Context.Name._M_string_length);
  local_88.Context.Line = local_c8.Context.Line;
  local_88.Snapshot.State = local_c8.Snapshot.State;
  local_88.Snapshot.Position.Tree = local_c8.Snapshot.Position.Tree;
  local_88.Snapshot.Position.Position = local_c8.Snapshot.Position.Position;
  cmState::Directory::AppendProperty(&local_48,prop,value,asString,&local_88);
  cmListFileBacktrace::~cmListFileBacktrace(&local_88);
  cmListFileBacktrace::~cmListFileBacktrace(&local_c8);
  return;
}

Assistant:

void cmMakefile::AppendProperty(const std::string& prop,
                                const char* value,
                                bool asString)
{
  cmListFileBacktrace lfbt = this->GetBacktrace();
  this->StateSnapshot.GetDirectory().AppendProperty(prop, value,
                                                    asString, lfbt);
}